

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

Object * allocate_object(Vm *vm,size_t size,ObjectType type)

{
  Object *pOVar1;
  Object *object;
  ObjectType type_local;
  size_t size_local;
  Vm *vm_local;
  
  if ((vm->current_status == VM_STATUS_RUNNING) && (vm->max_alloc_mem <= vm->allocated_mem)) {
    gc(vm);
  }
  pOVar1 = (Object *)malloc(size);
  pOVar1->type = type;
  pOVar1->marked = '\x01';
  pOVar1->next = vm->first_object;
  vm->first_object = pOVar1;
  vm->allocated_mem = size + vm->allocated_mem;
  return pOVar1;
}

Assistant:

static Object *allocate_object(Vm *vm, size_t size, ObjectType type) {
    if (vm->current_status == VM_STATUS_RUNNING && vm->allocated_mem >= vm->max_alloc_mem) {
        gc(vm);
    }

    Object *object = malloc(size);
    object->type = type;
    object->marked = true;

    object->next = vm->first_object;
    vm->first_object = object;
    vm->allocated_mem += size;

#if DEBUG_TRACE_GC
    printf("[%p] Allocated %ld bytes for object of type %d\n", object, size, type);
#endif

    return object;
}